

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameWalkTrigger(Walker *pWalker,Trigger *pTrigger)

{
  undefined8 *puVar1;
  Upsert *pUpsert;
  TriggerStep *pStep;
  Trigger *pTrigger_local;
  Walker *pWalker_local;
  
  sqlite3WalkExpr(pWalker,pTrigger->pWhen);
  for (pUpsert = (Upsert *)pTrigger->step_list; pUpsert != (Upsert *)0x0;
      pUpsert = (Upsert *)pUpsert[1].pUpsertTargetWhere) {
    sqlite3WalkSelect(pWalker,(Select *)pUpsert->pUpsertSet);
    sqlite3WalkExpr(pWalker,(Expr *)pUpsert->pUpsertIdx);
    sqlite3WalkExprList(pWalker,(ExprList *)pUpsert->pUpsertSrc);
    if (*(long *)&pUpsert->iIdxCur != 0) {
      puVar1 = *(undefined8 **)&pUpsert->iIdxCur;
      sqlite3WalkExprList(pWalker,(ExprList *)*puVar1);
      sqlite3WalkExprList(pWalker,(ExprList *)puVar1[2]);
      sqlite3WalkExpr(pWalker,(Expr *)puVar1[3]);
      sqlite3WalkExpr(pWalker,(Expr *)puVar1[1]);
    }
  }
  return;
}

Assistant:

static void renameWalkTrigger(Walker *pWalker, Trigger *pTrigger){
  TriggerStep *pStep;

  /* Find tokens to edit in WHEN clause */
  sqlite3WalkExpr(pWalker, pTrigger->pWhen);

  /* Find tokens to edit in trigger steps */
  for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
    sqlite3WalkSelect(pWalker, pStep->pSelect);
    sqlite3WalkExpr(pWalker, pStep->pWhere);
    sqlite3WalkExprList(pWalker, pStep->pExprList);
    if( pStep->pUpsert ){
      Upsert *pUpsert = pStep->pUpsert;
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertTarget);
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertSet);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertWhere);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertTargetWhere);
    }
  }
}